

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTime.c
# Opt level: O3

float Map_TimeComputeArrivalMax(Map_Man_t *p)

{
  float fVar1;
  int iVar2;
  long lVar3;
  float local_14;
  
  if (p->nOutputs < 1) {
    local_14 = -3.4028235e+37;
  }
  else {
    local_14 = -3.4028235e+37;
    lVar3 = 0;
    do {
      iVar2 = Map_NodeIsConst(p->pOutputs[lVar3]);
      if ((iVar2 == 0) &&
         (fVar1 = *(float *)(((ulong)p->pOutputs[lVar3] & 0xfffffffffffffffe) + 0x68 +
                            (ulong)(~(uint)p->pOutputs[lVar3] & 1) * 0xc), local_14 <= fVar1)) {
        local_14 = fVar1;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < p->nOutputs);
  }
  return local_14;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes the maximum arrival times.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
float Map_TimeComputeArrivalMax( Map_Man_t * p )
{
    float tReqMax, tReq;
    int i, fPhase;
    // get the critical PO arrival time
    tReqMax = -MAP_FLOAT_LARGE;
    for ( i = 0; i < p->nOutputs; i++ )
    {
        if ( Map_NodeIsConst(p->pOutputs[i]) )
            continue;
        fPhase  = !Map_IsComplement(p->pOutputs[i]);
        tReq    = Map_Regular(p->pOutputs[i])->tArrival[fPhase].Worst;
        tReqMax = MAP_MAX( tReqMax, tReq );
    }
    return tReqMax;
}